

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

pair<HighsSplitDeque::Status,_HighsTask_*> __thiscall HighsSplitDeque::pop(HighsSplitDeque *this)

{
  bool bVar1;
  long in_RDI;
  pair<HighsSplitDeque::Status,_HighsTask_*> pVar2;
  HighsSplitDeque *unaff_retaddr;
  element_type *in_stack_ffffffffffffff48;
  array<HighsTask,_8192UL> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  HighsSplitDeque *in_stack_ffffffffffffffa0;
  pair<HighsSplitDeque::Status,_std::nullptr_t> local_40;
  pair<HighsSplitDeque::Status,_HighsTask_*> local_28;
  __int_type local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  element_type *local_8;
  
  if (*(int *)(in_RDI + 0x20) == 0) {
    std::make_pair<HighsSplitDeque::Status,decltype(nullptr)>
              ((Status *)in_stack_ffffffffffffff50,(void **)in_stack_ffffffffffffff48);
    std::pair<HighsSplitDeque::Status,_HighsTask_*>::
    pair<HighsSplitDeque::Status,_std::nullptr_t,_true>(&local_28,&local_40);
  }
  else if (*(uint *)(in_RDI + 0x20) < 0x2001) {
    if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
      if ((*(int *)(in_RDI + 0x24) == *(int *)(in_RDI + 0x20)) &&
         (bVar1 = shrinkShared(in_stack_ffffffffffffffa0), bVar1)) {
        std::array<HighsTask,_8192UL>::operator[]
                  (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pVar2 = std::make_pair<HighsSplitDeque::Status,HighsTask*>
                          ((Status *)in_stack_ffffffffffffff50,
                           (HighsTask **)in_stack_ffffffffffffff48);
        local_28.second = pVar2.second;
        local_28.first = pVar2.first;
      }
      else {
        *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
        if (*(int *)(in_RDI + 0x20) == 0) {
          if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
            *(undefined1 *)(in_RDI + 0x38) = 1;
            std::atomic<bool>::store
                      ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                       ,SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0),
                       (memory_order)in_stack_ffffffffffffff60);
            in_stack_ffffffffffffff48 =
                 std::
                 __shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4bd8e9);
            local_c = 0xffffffff;
            local_10 = 3;
            local_14 = 0xffffffff;
            in_stack_ffffffffffffff50 = (array<HighsTask,_8192UL> *)0x2;
            LOCK();
            local_18 = (in_stack_ffffffffffffff48->haveJobs).super___atomic_base<int>._M_i;
            (in_stack_ffffffffffffff48->haveJobs).super___atomic_base<int>._M_i =
                 (in_stack_ffffffffffffff48->haveJobs).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            local_8 = in_stack_ffffffffffffff48;
          }
        }
        else if (*(int *)(in_RDI + 0x20) != *(int *)(in_RDI + 0x24)) {
          growShared(unaff_retaddr);
        }
        std::array<HighsTask,_8192UL>::operator[]
                  (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        pVar2 = std::make_pair<HighsSplitDeque::Status,HighsTask*>
                          ((Status *)in_stack_ffffffffffffff50,
                           (HighsTask **)in_stack_ffffffffffffff48);
        local_28.second = pVar2.second;
        local_28.first = pVar2.first;
      }
    }
    else {
      std::array<HighsTask,_8192UL>::operator[]
                (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      pVar2 = std::make_pair<HighsSplitDeque::Status,HighsTask*>
                        ((Status *)in_stack_ffffffffffffff50,(HighsTask **)in_stack_ffffffffffffff48
                        );
      local_28.second = pVar2.second;
      local_28.first = pVar2.first;
    }
  }
  else {
    *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
    std::make_pair<HighsSplitDeque::Status,decltype(nullptr)>
              ((Status *)in_stack_ffffffffffffff50,(void **)in_stack_ffffffffffffff48);
    std::pair<HighsSplitDeque::Status,_HighsTask_*>::
    pair<HighsSplitDeque::Status,_std::nullptr_t,_true>
              (&local_28,(pair<HighsSplitDeque::Status,_std::nullptr_t> *)&stack0xffffffffffffffa0);
  }
  pVar2._4_4_ = 0;
  pVar2.first = local_28.first;
  pVar2.second = local_28.second;
  return pVar2;
}

Assistant:

std::pair<Status, HighsTask*> pop() {
    if (ownerData.head == 0) return std::make_pair(Status::kEmpty, nullptr);

    if (ownerData.head > kTaskArraySize) {
      // task queue was full and the overflown tasks have
      // been directly executed
      ownerData.head -= 1;
      return std::make_pair(Status::kOverflown, nullptr);
    }

    if (ownerData.allStolenCopy)
      return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);

    if (ownerData.splitCopy == ownerData.head) {
      if (shrinkShared())
        return std::make_pair(Status::kStolen, &taskArray[ownerData.head - 1]);
    }

    ownerData.head -= 1;

    if (ownerData.head == 0) {
      if (!ownerData.allStolenCopy) {
        ownerData.allStolenCopy = true;
        stealerData.allStolen.store(true, std::memory_order_relaxed);
        ownerData.workerBunk->haveJobs.fetch_add(-1, std::memory_order_release);
      }
    } else if (ownerData.head != ownerData.splitCopy)
      growShared();

    return std::make_pair(Status::kWork, &taskArray[ownerData.head]);
  }